

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O0

HeapEntry<duckdb::string_t> * __thiscall
duckdb::HeapEntry<duckdb::string_t>::operator=
          (HeapEntry<duckdb::string_t> *this,HeapEntry<duckdb::string_t> *other)

{
  bool bVar1;
  idx_t in;
  string_t *in_RSI;
  HeapEntry<duckdb::string_t> *in_RDI;
  undefined4 local_20;
  uint32_t in_stack_ffffffffffffffe4;
  char *in_stack_ffffffffffffffe8;
  
  bVar1 = string_t::IsInlined((string_t *)0xfba642);
  if (bVar1) {
    *(undefined8 *)&(in_RDI->value).value = *(undefined8 *)&in_RSI->value;
    (in_RDI->value).value.pointer.ptr = (in_RSI->value).pointer.ptr;
  }
  else {
    in_RDI->capacity = in_RSI[1].value.pointer.length;
    in_RDI->allocated_data = (data_ptr_t)in_RSI[1].value.pointer.ptr;
    const_char_ptr_cast<unsigned_char>(in_RDI->allocated_data);
    in = string_t::GetSize(in_RSI);
    UnsafeNumericCast<unsigned_int,unsigned_long,void>(in);
    string_t::string_t(in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4);
    *(ulong *)&(in_RDI->value).value = CONCAT44(in_stack_ffffffffffffffe4,local_20);
    (in_RDI->value).value.pointer.ptr = in_stack_ffffffffffffffe8;
    in_RSI[1].value.pointer.ptr = (char *)0x0;
  }
  return in_RDI;
}

Assistant:

HeapEntry &operator=(HeapEntry &&other) noexcept {
		if (other.value.IsInlined()) {
			value = other.value;
		} else {
			capacity = other.capacity;
			allocated_data = other.allocated_data;
			value = string_t(const_char_ptr_cast(allocated_data), UnsafeNumericCast<uint32_t>(other.value.GetSize()));
			other.allocated_data = nullptr;
		}
		return *this;
	}